

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.h
# Opt level: O3

void __thiscall jrtplib::RTCPSDESInfo::SDESPrivateItem::~SDESPrivateItem(SDESPrivateItem *this)

{
  RTPMemoryManager *pRVar1;
  
  (this->super_SDESItem).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__SDESPrivateItem_0013ca60;
  if (this->prefix != (uint8_t *)0x0) {
    pRVar1 = (this->super_SDESItem).super_RTPMemoryObject.mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      operator_delete__(this->prefix);
    }
    else {
      (**(code **)(*(long *)pRVar1 + 0x18))();
    }
  }
  SDESItem::~SDESItem(&this->super_SDESItem);
  return;
}

Assistant:

~SDESPrivateItem()						
		{ 
			if (prefix) 
				RTPDeleteByteArray(prefix,GetMemoryManager());
		}